

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

Data * __thiscall Bracket::eval(Bracket *this,Runtime *runtime)

{
  string *name;
  _List_node_base *p_Var1;
  long *plVar2;
  int iVar3;
  vector<Data_*,_std::allocator<Data_*>_> *pvVar4;
  Data *pDVar5;
  tms *__buffer;
  ulong uVar6;
  Data *data;
  long lVar7;
  pointer ppDVar8;
  _Self __tmp;
  ulong uVar9;
  _List_node_base *p_Var10;
  
  Runtime::pushVarEnv(runtime);
  name = &this->func;
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    pvVar4 = genParaData(this,runtime);
    pDVar5 = Data::plus(pvVar4);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      pvVar4 = genParaData(this,runtime);
      pDVar5 = Data::minus(pvVar4);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        __buffer = (tms *)genParaData(this,runtime);
        pDVar5 = (Data *)Data::times(__buffer);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        if (iVar3 == 0) {
          pvVar4 = genParaData(this,runtime);
          pDVar5 = Data::bigger(pvVar4);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 == 0) {
            pvVar4 = genParaData(this,runtime);
            pDVar5 = Data::smaller(pvVar4);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 == 0) {
              pvVar4 = genParaData(this,runtime);
              pDVar5 = Data::divide(pvVar4);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)name);
              if (iVar3 == 0) {
                pvVar4 = genParaData(this,runtime);
                pDVar5 = Data::mod(pvVar4);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)name);
                if (iVar3 == 0) {
                  pvVar4 = genParaData(this,runtime);
                  pDVar5 = Data::equal(pvVar4);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)name);
                  if (iVar3 == 0) {
                    p_Var10 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl
                              ._M_node.super__List_node_base._M_next;
                    p_Var1 = p_Var10[1]._M_next;
                    plVar2 = (long *)p_Var10->_M_next[1]._M_next;
                    pDVar5 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                    Runtime::setVar(runtime,(string *)&p_Var1->_M_prev,pDVar5);
                    pDVar5 = Data::trueData;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)name);
                    if (iVar3 == 0) {
                      p_Var10 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>.
                                _M_impl._M_node.super__List_node_base._M_next[1]._M_next;
                      pDVar5 = (Data *)(**(code **)((long)p_Var10->_M_next + 0x18))(p_Var10,runtime)
                      ;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)name);
                      if (iVar3 == 0) {
                        p_Var10 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>.
                                  _M_impl._M_node.super__List_node_base._M_next;
                        p_Var1 = p_Var10[1]._M_next;
                        plVar2 = (long *)p_Var10->_M_next[1]._M_next;
                        pDVar5 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                        Runtime::assignVar(runtime,(string *)&p_Var1->_M_prev,pDVar5);
                        pDVar5 = Data::trueData;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)name);
                        if (iVar3 == 0) {
                          pvVar4 = genParaData(this,runtime);
                          ppDVar8 = (pvVar4->super__Vector_base<Data_*,_std::allocator<Data_*>_>).
                                    _M_impl.super__Vector_impl_data._M_start;
                          if ((long)(pvVar4->super__Vector_base<Data_*,_std::allocator<Data_*>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar8 == 8)
                          {
                            uVar6 = 0;
                          }
                          else {
                            uVar9 = 0;
                            do {
                              Data::check(ppDVar8[uVar9]);
                              uVar9 = uVar9 + 1;
                              ppDVar8 = (pvVar4->super__Vector_base<Data_*,_std::allocator<Data_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start;
                              uVar6 = ((long)(pvVar4->
                                             super__Vector_base<Data_*,_std::allocator<Data_*>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppDVar8 >> 3) - 1;
                            } while (uVar9 < uVar6);
                          }
                          pDVar5 = ppDVar8[uVar6];
                          operator_delete(ppDVar8);
                          operator_delete(pvVar4);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)name);
                          if (iVar3 == 0) {
                            pvVar4 = genParaData(this,runtime);
                            pDVar5 = Data::print(pvVar4);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)name);
                            if (iVar3 == 0) {
                              pvVar4 = genParaData(this,runtime);
                              pDVar5 = Data::display(pvVar4);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)name);
                              if (iVar3 == 0) {
                                p_Var10 = (this->para).
                                          super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl.
                                          _M_node.super__List_node_base._M_next;
                                data = (Data *)(**(code **)((long)(p_Var10[1]._M_next)->_M_next +
                                                           0x18))(p_Var10[1]._M_next,runtime);
                                lVar7 = __dynamic_cast(data,&Data::typeinfo,&Bool::typeinfo,0);
                                if (*(char *)(lVar7 + 0xc) == '\0') {
                                  p_Var10 = p_Var10->_M_next;
                                }
                                plVar2 = (long *)p_Var10->_M_next[1]._M_next;
                                pDVar5 = (Data *)(**(code **)(*plVar2 + 0x18))(plVar2,runtime);
                                Data::check(data);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)name);
                                if (iVar3 == 0) {
                                  Function::newFunction(&this->para);
                                  pDVar5 = Data::trueData;
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)name);
                                  if (iVar3 == 0) {
                                    Runtime::display(runtime);
                                    pDVar5 = Data::trueData;
                                  }
                                  else {
                                    pvVar4 = genParaData(this,runtime);
                                    pDVar5 = Function::call(name,pvVar4);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Runtime::popVarEnv(runtime);
  return pDVar5;
}

Assistant:

Data *Bracket::eval(Runtime *runtime) {
    runtime->pushVarEnv();
    Data *result;
    if (func == "+") {
        result = Data::plus(genParaData(runtime));
    } else if (func == "-") {
        result = Data::minus(genParaData(runtime));
    } else if (func == "*") {
        result = Data::times(genParaData(runtime));
    } else if (func == ">") {
        result = Data::bigger(genParaData(runtime));
    } else if (func == "<") {
        result = Data::smaller(genParaData(runtime));
    } else if (func == "/") {
        result = Data::divide(genParaData(runtime));
    } else if (func == "%") {
        result = Data::mod(genParaData(runtime));
    } else if (func == "=") {
        result = Data::equal(genParaData(runtime));
    } else if (func == "set") {
        runtime->setVar(((Symbol *) (*para.begin()))->name,
                        (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "echo") {
        result = (*para.begin())->eval(runtime);
    } else if (func == "assign") {
        runtime->assignVar(((Symbol *) (*para.begin()))->name,
                           (*(++para.begin()))->eval(runtime));
        result = Data::trueData;
    } else if (func == "begin") {
        auto temp = genParaData(runtime);
        for (auto i = 0; i < temp->size() - 1; i++) {
            Data::check((*temp)[i]);
        }
        result = (*temp)[temp->size()-1];
        delete temp;
    } else if (func == "print") {
        result = Data::print(genParaData(runtime));
    } else if (func == "display") {
        result = Data::display(genParaData(runtime)); 
    } else if (func == "if") {
        auto cursor = para.begin();
        auto temp = (*cursor)->eval(runtime);
        Bool *judge = dynamic_cast<Bool *>(temp);
        if (judge->value) {
            cursor++;
        } else {
            cursor++;
            cursor++;
        }
        result = (*cursor)->eval(runtime);
        Data::check(temp);
    } else if (func == "function") {
        Function::newFunction(&para);
        result = Data::trueData;
    } else if (func == "runtime") {
        runtime->display();
        result = Data::trueData;
    } else {
        result = Function::call(func, genParaData(runtime));
    }
    runtime->popVarEnv();
    return result;
}